

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ImplicitTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitTypeSyntax,slang::syntax::ImplicitTypeSyntax_const&>
          (BumpAllocator *this,ImplicitTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ImplicitTypeSyntax *pIVar8;
  
  pIVar8 = (ImplicitTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitTypeSyntax *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (ImplicitTypeSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  (pIVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  (pIVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pIVar8->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->signing).field_0x2;
  NVar6.raw = (args->signing).numFlags.raw;
  uVar7 = (args->signing).rawLen;
  pIVar2 = (args->signing).info;
  (pIVar8->signing).kind = (args->signing).kind;
  (pIVar8->signing).field_0x2 = uVar5;
  (pIVar8->signing).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->signing).rawLen = uVar7;
  (pIVar8->signing).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->dimensions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pIVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pIVar8->dimensions).super_SyntaxListBase.childCount =
       (args->dimensions).super_SyntaxListBase.childCount;
  sVar3 = (args->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->dimensions).
           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar3;
  (pIVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005ae338;
  uVar5 = (args->placeholder).field_0x2;
  NVar6.raw = (args->placeholder).numFlags.raw;
  uVar7 = (args->placeholder).rawLen;
  pIVar2 = (args->placeholder).info;
  (pIVar8->placeholder).kind = (args->placeholder).kind;
  (pIVar8->placeholder).field_0x2 = uVar5;
  (pIVar8->placeholder).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->placeholder).rawLen = uVar7;
  (pIVar8->placeholder).info = pIVar2;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }